

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

NodeSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::newGroupNode
          (NodeSourceInfoBuilderPair *__return_storage_ptr__,StructTranslator *this,Reader parent,
          Reader decl)

{
  byte *pbVar1;
  undefined4 uVar2;
  byte bVar3;
  undefined4 uVar4;
  Reader *in_R8;
  Reader value;
  BuilderFor<capnp::schema::Node::SourceInfo> sourceInfo;
  AuxNode aux;
  undefined1 local_101 [9];
  int local_f8;
  Builder local_f0;
  Reader local_c8;
  Builder local_98;
  AuxNode local_70;
  ArrayPtr<const_char> local_30;
  
  Orphanage::newOrphan<capnp::schema::Node>(&local_70.node,&this->translator->orphanage);
  Orphanage::newOrphan<capnp::schema::Node::SourceInfo>
            (&local_70.sourceInfo,&this->translator->orphanage);
  capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::apply
            (&local_f0,(OrphanBuilder *)&local_70);
  capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::apply
            (&local_98,&local_70.sourceInfo.builder);
  Declaration::Reader::getName(&local_c8,&decl);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_c8);
  local_30 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&parent);
  local_101[0] = 0x2e;
  kj::str<capnp::Text::Reader,char,capnp::Text::Reader&>
            ((String *)&local_c8,(kj *)&local_30,(Reader *)local_101,local_101 + 1,in_R8);
  if (local_c8._reader.capTable == (CapTableReader *)0x0) {
    local_c8._reader.segment = (SegmentReader *)0x4706a1;
  }
  value.super_StringPtr.content.size_ =
       (long)&(local_c8._reader.capTable)->_vptr_CapTableReader +
       (ulong)(local_c8._reader.capTable == (CapTableReader *)0x0);
  value.super_StringPtr.content.ptr = (char *)local_c8._reader.segment;
  capnp::schema::Node::Builder::setDisplayName(&local_f0,value);
  kj::Array<char>::~Array((Array<char> *)&local_c8);
  capnp::schema::Node::Builder::getDisplayName((Builder *)&local_c8,&local_f0);
  *(int *)((long)local_f0._builder.data + 8) = (int)local_c8._reader.data - local_f8;
  if (parent._reader.dataSize < 0x121) {
    bVar3 = 0;
  }
  else {
    bVar3 = *(byte *)((long)parent._reader.data + 0x24) & 1;
  }
  *(byte *)((long)local_f0._builder.data + 0x24) =
       *(byte *)((long)local_f0._builder.data + 0x24) & 0xfe | bVar3;
  capnp::schema::Node::Builder::initStruct((Builder *)&local_c8,&local_f0);
  pbVar1 = (byte *)(CONCAT44(local_c8._reader.data._4_4_,(int)local_c8._reader.data) + 0x1c);
  *pbVar1 = *pbVar1 | 1;
  if (decl._reader.dataSize < 0x40) {
    *(undefined8 *)((long)local_f0._builder.data + 0x28) = 0;
    *(undefined4 *)((long)local_98._builder.data + 8) = 0;
    uVar2 = 0;
  }
  else {
    *(undefined4 *)((long)local_f0._builder.data + 0x28) =
         *(undefined4 *)((long)decl._reader.data + 4);
    uVar2 = 0;
    uVar4 = 0;
    if (0x5f < decl._reader.dataSize) {
      uVar4 = *(undefined4 *)((long)decl._reader.data + 8);
    }
    *(undefined4 *)((long)local_f0._builder.data + 0x2c) = uVar4;
    *(undefined4 *)((long)local_98._builder.data + 8) = *(undefined4 *)((long)decl._reader.data + 4)
    ;
    if (0x5f < decl._reader.dataSize) {
      uVar2 = *(undefined4 *)((long)decl._reader.data + 8);
    }
  }
  *(undefined4 *)((long)local_98._builder.data + 0xc) = uVar2;
  kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::
  add<capnp::compiler::NodeTranslator::AuxNode>(&this->translator->groups,&local_70);
  (__return_storage_ptr__->node)._builder.dataSize = local_f0._builder.dataSize;
  (__return_storage_ptr__->node)._builder.pointerCount = local_f0._builder.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->node)._builder.field_0x26 = local_f0._builder._38_2_;
  (__return_storage_ptr__->node)._builder.data = local_f0._builder.data;
  (__return_storage_ptr__->node)._builder.pointers = local_f0._builder.pointers;
  (__return_storage_ptr__->node)._builder.segment = local_f0._builder.segment;
  (__return_storage_ptr__->node)._builder.capTable = local_f0._builder.capTable;
  (__return_storage_ptr__->sourceInfo)._builder.segment = local_98._builder.segment;
  (__return_storage_ptr__->sourceInfo)._builder.capTable = local_98._builder.capTable;
  (__return_storage_ptr__->sourceInfo)._builder.data = local_98._builder.data;
  (__return_storage_ptr__->sourceInfo)._builder.pointers = local_98._builder.pointers;
  (__return_storage_ptr__->sourceInfo)._builder.dataSize = local_98._builder.dataSize;
  (__return_storage_ptr__->sourceInfo)._builder.pointerCount = local_98._builder.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->sourceInfo)._builder.field_0x26 =
       local_98._builder._38_2_;
  AuxNode::~AuxNode(&local_70);
  return __return_storage_ptr__;
}

Assistant:

NodeSourceInfoBuilderPair newGroupNode(schema::Node::Reader parent, Declaration::Reader decl) {
    AuxNode aux {
      translator.orphanage.newOrphan<schema::Node>(),
      translator.orphanage.newOrphan<schema::Node::SourceInfo>()
    };
    auto node = aux.node.get();
    auto sourceInfo = aux.sourceInfo.get();
    auto name = decl.getName().getValue();

    // We'll set the ID and scope ID later.
    node.setDisplayName(kj::str(parent.getDisplayName(), '.', name));
    node.setDisplayNamePrefixLength(node.getDisplayName().size() - name.size());
    node.setIsGeneric(parent.getIsGeneric());
    node.initStruct().setIsGroup(true);
    node.setStartByte(decl.getStartByte());
    node.setEndByte(decl.getEndByte());

    sourceInfo.setStartByte(decl.getStartByte());
    sourceInfo.setEndByte(decl.getEndByte());

    // The remaining contents of node.struct will be filled in later.

    translator.groups.add(kj::mv(aux));
    return { node, sourceInfo };
  }